

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int genHouseTower(PieceEnv *env,Piece *current,int depth)

{
  uint rot_00;
  int iVar1;
  Piece *pPVar2;
  int in_EDX;
  Piece *in_RSI;
  PieceEnv *in_RDI;
  int size;
  Piece *base;
  int rot;
  int in_stack_00000054;
  Piece *in_stack_00000058;
  PieceEnv *in_stack_00000060;
  piecefunc_t *in_stack_00000068;
  int local_4;
  
  if (in_EDX < 9) {
    rot_00 = (uint)in_RSI->rot;
    pPVar2 = addEndCityPiece(in_RDI,in_RSI,rot_00,-3,in_RDI->y,-0xb,0);
    iVar1 = nextInt((uint64_t *)in_RSI,in_EDX);
    if (iVar1 == 0) {
      addEndCityPiece(in_RDI,pPVar2,rot_00,-1,4,-1,1);
      local_4 = 1;
    }
    else {
      pPVar2 = addEndCityPiece(in_RDI,pPVar2,rot_00,-1,0,-1,10);
      if (iVar1 == 1) {
        addEndCityPiece(in_RDI,pPVar2,rot_00,-1,8,-1,0xb);
      }
      else {
        pPVar2 = addEndCityPiece(in_RDI,pPVar2,rot_00,-1,4,-1,0xe);
        addEndCityPiece(in_RDI,pPVar2,rot_00,-1,8,-1,0xf);
      }
      genPiecesRecusively(in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054);
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static
int genHouseTower(PieceEnv *env, Piece *current, int depth)
{
    if (depth > 8) return 0;
    int rot = current->rot;
    Piece *base = current;
    base = addEndCityPiece(env, base, rot, -3, env->y, -11, BASE_FLOOR);
    int size = nextInt(env->rng, 3);
    if (size == 0)
    {
        addEndCityPiece(env, base, rot, -1, 4, -1, BASE_ROOF);
        return 1;
    }
    base = addEndCityPiece(env, base, rot, -1, 0, -1, SECOND_FLOOR_2);
    if (size == 1)
    {
        base = addEndCityPiece(env, base, rot, -1, 8, -1, SECOND_ROOF);
    }
    else
    {
        base = addEndCityPiece(env, base, rot, -1, 4, -1, THIRD_FLOOR_2);
        base = addEndCityPiece(env, base, rot, -1, 8, -1, THIRD_ROOF);
    }
    genPiecesRecusively(genTower, env, base, depth+1);
    return 1;
}